

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_1::ValidateGroupNonUniformElect(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  spv_result_t sVar2;
  DiagnosticStream DStack_1f8;
  
  bVar1 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
  sVar2 = SPV_SUCCESS;
  if (!bVar1) {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&DStack_1f8,"Result must be a boolean scalar type",0x24);
    DiagnosticStream::~DiagnosticStream(&DStack_1f8);
    sVar2 = DStack_1f8.error_;
  }
  return sVar2;
}

Assistant:

spv_result_t ValidateGroupNonUniformElect(ValidationState_t& _,
                                          const Instruction* inst) {
  if (!_.IsBoolScalarType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result must be a boolean scalar type";
  }

  return SPV_SUCCESS;
}